

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O0

void digest_(Spec_Hash_Definitions_hash_alg a,Hacl_Hash_SHA3_state_t *state,uint8_t *output,
            uint32_t l)

{
  uint64_t *__src;
  uint8_t *blocks;
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  __uint64_t _Var7;
  ulong uVar8;
  uint8_t *uu____6;
  uint32_t i_19;
  uint64_t ws [32];
  uint8_t hbuf [256];
  uint32_t remOut;
  uint64_t c_1;
  uint64_t v4_9;
  uint64_t v3_9;
  uint64_t v2_9;
  uint64_t v1_9;
  uint64_t v0_9;
  uint64_t v4_8;
  uint64_t v3_8;
  uint64_t v2_8;
  uint64_t v1_8;
  uint64_t v0_8;
  uint64_t v4_7;
  uint64_t v3_7;
  uint64_t v2_7;
  uint64_t v1_7;
  uint64_t v0_7;
  uint64_t v4_6;
  uint64_t v3_6;
  uint64_t v2_6;
  uint64_t v1_6;
  uint64_t v0_6;
  uint64_t v4_5;
  uint64_t v3_5;
  uint64_t v2_5;
  uint64_t v1_5;
  uint64_t v0_5;
  uint32_t i_18;
  uint64_t uu____5;
  uint64_t temp_1;
  uint32_t r1_1;
  uint32_t _Y_1;
  uint32_t i_17;
  uint64_t current_1;
  uint64_t x_1;
  uint32_t i_16;
  uint64_t _D_9;
  uint64_t uu____4_4;
  uint32_t i_15;
  uint64_t _D_8;
  uint64_t uu____4_3;
  uint32_t i_14;
  uint64_t _D_7;
  uint64_t uu____4_2;
  uint32_t i_13;
  uint64_t _D_6;
  uint64_t uu____4_1;
  uint32_t i_12;
  uint64_t _D_5;
  uint64_t uu____4;
  uint32_t i2_1;
  uint32_t i_11;
  uint64_t _C_1 [5];
  uint local_9e4;
  uint32_t i1_1;
  uint8_t *uu____3;
  uint8_t *b0_1;
  uint32_t i_10;
  uint64_t ws_3 [32];
  uint8_t hbuf_3 [256];
  uint local_7c0;
  uint local_7bc;
  uint32_t i0_1;
  uint32_t i_9;
  uint64_t ws_1 [32];
  uint8_t hbuf_1 [256];
  uint32_t remOut_1;
  uint64_t c;
  uint64_t v4_4;
  uint64_t v3_4;
  uint64_t v2_4;
  uint64_t v1_4;
  uint64_t v0_4;
  uint64_t v4_3;
  uint64_t v3_3;
  uint64_t v2_3;
  uint64_t v1_3;
  uint64_t v0_3;
  uint64_t v4_2;
  uint64_t v3_2;
  uint64_t v2_2;
  uint64_t v1_2;
  uint64_t v0_2;
  uint64_t v4_1;
  uint64_t v3_1;
  uint64_t v2_1;
  uint64_t v1_1;
  uint64_t v0_1;
  uint64_t v4;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint32_t i_8;
  uint64_t uu____2;
  uint64_t temp;
  uint32_t r1;
  uint32_t _Y;
  uint32_t i_7;
  uint64_t current;
  uint64_t x;
  uint32_t i_6;
  uint64_t _D_4;
  uint64_t uu____1_4;
  uint32_t i_5;
  uint64_t _D_3;
  uint64_t uu____1_3;
  uint32_t i_4;
  uint64_t _D_2;
  uint64_t uu____1_2;
  uint32_t i_3;
  uint64_t _D_1;
  uint64_t uu____1_1;
  uint32_t i_2;
  uint64_t _D;
  uint64_t uu____1;
  uint32_t i2;
  uint32_t i_1;
  uint64_t _C [5];
  uint local_3f4;
  uint32_t i1;
  uint8_t *uu____0;
  uint8_t *b0;
  uint32_t i;
  uint64_t ws_2 [32];
  uint8_t hbuf_2 [256];
  uint32_t i0;
  uint64_t *s;
  Spec_Hash_Definitions_hash_alg a11;
  uint64_t *s1;
  Spec_Hash_Definitions_hash_alg a10;
  uint64_t *s0;
  Spec_Hash_Definitions_hash_alg a1;
  uint8_t *buf_multi;
  uint8_t *buf_last;
  uint32_t ite;
  uint64_t *s_src;
  uint64_t *s_dst;
  hash_buf2 scrut;
  Hacl_Hash_SHA3_hash_buf tmp_block_state;
  uint64_t buf [25];
  uint8_t *buf_1;
  uint32_t r;
  uint64_t total_len;
  uint8_t *buf_;
  Hacl_Hash_SHA3_hash_buf block_state;
  Hacl_Hash_SHA3_state_t scrut0;
  uint32_t l_local;
  uint8_t *output_local;
  Hacl_Hash_SHA3_state_t *state_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  __src = (state->block_state).snd;
  blocks = state->buf;
  uVar8 = state->total_len;
  uVar4 = block_len(a);
  if ((uVar8 % (ulong)uVar4 == 0) && (uVar8 != 0)) {
    buf_1._4_4_ = block_len(a);
  }
  else {
    uVar4 = block_len(a);
    buf_1._4_4_ = (uint32_t)(uVar8 % (ulong)uVar4);
  }
  memset(&tmp_block_state.snd,0,200);
  tmp_block_state._0_8_ = &tmp_block_state.snd;
  memcpy((void *)tmp_block_state._0_8_,__src,200);
  uVar4 = block_len(a);
  if ((buf_1._4_4_ % uVar4 == 0) && (buf_1._4_4_ != 0)) {
    buf_last._4_4_ = block_len(a);
  }
  else {
    uVar4 = block_len(a);
    buf_last._4_4_ = buf_1._4_4_ % uVar4;
  }
  uVar3 = tmp_block_state._0_8_;
  block_len(a);
  Hacl_Hash_SHA3_update_multi_sha3(a,(uint64_t *)uVar3,blocks,0);
  Hacl_Hash_SHA3_update_last_sha3
            (a,(uint64_t *)tmp_block_state._0_8_,
             blocks + ((ulong)buf_1._4_4_ - (ulong)buf_last._4_4_),buf_1._4_4_);
  uVar3 = tmp_block_state._0_8_;
  if ((a == '\f') || (a == '\r')) {
    hbuf_2[0xfc] = '\0';
    hbuf_2[0xfd] = '\0';
    hbuf_2[0xfe] = '\0';
    hbuf_2[0xff] = '\0';
    while( true ) {
      uVar4 = block_len(a);
      if (l / uVar4 <= (uint)hbuf_2._252_4_) break;
      memset(ws_2 + 0x1f,0,0x100);
      memset(&stack0xfffffffffffffc28,0,0x100);
      memcpy(&stack0xfffffffffffffc28,(void *)uVar3,200);
      for (b0._4_4_ = 0; b0._4_4_ < 0x20; b0._4_4_ = b0._4_4_ + 1) {
        _Var7 = __uint64_identity(ws_2[(ulong)b0._4_4_ - 1]);
        store64((uint8_t *)((long)ws_2 + (ulong)(b0._4_4_ << 3) + 0xf8),_Var7);
      }
      uVar4 = block_len(a);
      uVar5 = block_len(a);
      memcpy(output + hbuf_2._252_4_ * uVar4,ws_2 + 0x1f,(ulong)uVar5);
      for (local_3f4 = 0; local_3f4 < 0x18; local_3f4 = local_3f4 + 1) {
        memset(&i2,0,0x28);
        _i2 = *(ulong *)uVar3 ^
              *(ulong *)(uVar3 + 0x28) ^
              *(ulong *)(uVar3 + 0x50) ^ *(ulong *)(uVar3 + 0x78) ^ *(ulong *)(uVar3 + 0xa0);
        _C[0] = *(ulong *)(uVar3 + 8) ^
                *(ulong *)(uVar3 + 0x30) ^
                *(ulong *)(uVar3 + 0x58) ^ *(ulong *)(uVar3 + 0x80) ^ *(ulong *)(uVar3 + 0xa8);
        _C[1] = *(ulong *)(uVar3 + 0x10) ^
                *(ulong *)(uVar3 + 0x38) ^
                *(ulong *)(uVar3 + 0x60) ^ *(ulong *)(uVar3 + 0x88) ^ *(ulong *)(uVar3 + 0xb0);
        _C[2] = *(ulong *)(uVar3 + 0x18) ^
                *(ulong *)(uVar3 + 0x40) ^
                *(ulong *)(uVar3 + 0x68) ^ *(ulong *)(uVar3 + 0x90) ^ *(ulong *)(uVar3 + 0xb8);
        _C[3] = *(ulong *)(uVar3 + 0x20) ^
                *(ulong *)(uVar3 + 0x48) ^
                *(ulong *)(uVar3 + 0x70) ^ *(ulong *)(uVar3 + 0x98) ^ *(ulong *)(uVar3 + 0xc0);
        uVar8 = _C[3] ^ (_C[0] << 1 | _C[0] >> 0x3f);
        *(ulong *)uVar3 = *(ulong *)uVar3 ^ uVar8;
        *(ulong *)(uVar3 + 0x28) = *(ulong *)(uVar3 + 0x28) ^ uVar8;
        *(ulong *)(uVar3 + 0x50) = *(ulong *)(uVar3 + 0x50) ^ uVar8;
        *(ulong *)(uVar3 + 0x78) = *(ulong *)(uVar3 + 0x78) ^ uVar8;
        *(ulong *)(uVar3 + 0xa0) = *(ulong *)(uVar3 + 0xa0) ^ uVar8;
        uVar8 = _i2 ^ (_C[1] << 1 | _C[1] >> 0x3f);
        *(ulong *)(uVar3 + 8) = *(ulong *)(uVar3 + 8) ^ uVar8;
        *(ulong *)(uVar3 + 0x30) = *(ulong *)(uVar3 + 0x30) ^ uVar8;
        *(ulong *)(uVar3 + 0x58) = *(ulong *)(uVar3 + 0x58) ^ uVar8;
        *(ulong *)(uVar3 + 0x80) = *(ulong *)(uVar3 + 0x80) ^ uVar8;
        *(ulong *)(uVar3 + 0xa8) = *(ulong *)(uVar3 + 0xa8) ^ uVar8;
        uVar8 = _C[0] ^ (_C[2] << 1 | _C[2] >> 0x3f);
        *(ulong *)(uVar3 + 0x10) = *(ulong *)(uVar3 + 0x10) ^ uVar8;
        *(ulong *)(uVar3 + 0x38) = *(ulong *)(uVar3 + 0x38) ^ uVar8;
        *(ulong *)(uVar3 + 0x60) = *(ulong *)(uVar3 + 0x60) ^ uVar8;
        *(ulong *)(uVar3 + 0x88) = *(ulong *)(uVar3 + 0x88) ^ uVar8;
        *(ulong *)(uVar3 + 0xb0) = *(ulong *)(uVar3 + 0xb0) ^ uVar8;
        uVar8 = _C[1] ^ (_C[3] << 1 | _C[3] >> 0x3f);
        *(ulong *)(uVar3 + 0x18) = *(ulong *)(uVar3 + 0x18) ^ uVar8;
        *(ulong *)(uVar3 + 0x40) = *(ulong *)(uVar3 + 0x40) ^ uVar8;
        *(ulong *)(uVar3 + 0x68) = *(ulong *)(uVar3 + 0x68) ^ uVar8;
        *(ulong *)(uVar3 + 0x90) = *(ulong *)(uVar3 + 0x90) ^ uVar8;
        *(ulong *)(uVar3 + 0xb8) = *(ulong *)(uVar3 + 0xb8) ^ uVar8;
        uVar8 = _C[2] ^ (_i2 << 1 | _i2 >> 0x3f);
        *(ulong *)(uVar3 + 0x20) = *(ulong *)(uVar3 + 0x20) ^ uVar8;
        *(ulong *)(uVar3 + 0x48) = *(ulong *)(uVar3 + 0x48) ^ uVar8;
        *(ulong *)(uVar3 + 0x70) = *(ulong *)(uVar3 + 0x70) ^ uVar8;
        *(ulong *)(uVar3 + 0x98) = *(ulong *)(uVar3 + 0x98) ^ uVar8;
        *(ulong *)(uVar3 + 0xc0) = *(ulong *)(uVar3 + 0xc0) ^ uVar8;
        __Y = *(ulong *)(uVar3 + 8);
        for (r1 = 0; r1 < 0x18; r1 = r1 + 1) {
          uVar8 = *(ulong *)(uVar3 + (ulong)Hacl_Hash_SHA3_keccak_piln[r1] * 8);
          *(ulong *)(uVar3 + (ulong)Hacl_Hash_SHA3_keccak_piln[r1] * 8) =
               __Y << ((byte)Hacl_Hash_SHA3_keccak_rotc[r1] & 0x3f) |
               __Y >> (0x40 - (byte)Hacl_Hash_SHA3_keccak_rotc[r1] & 0x3f);
          __Y = uVar8;
        }
        uVar8 = *(ulong *)uVar3;
        uVar1 = *(ulong *)uVar3;
        uVar2 = *(ulong *)(uVar3 + 8);
        *(ulong *)uVar3 =
             *(ulong *)uVar3 ^
             (*(ulong *)(uVar3 + 8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x10);
        *(ulong *)(uVar3 + 8) =
             *(ulong *)(uVar3 + 8) ^
             (*(ulong *)(uVar3 + 0x10) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x18);
        *(ulong *)(uVar3 + 0x10) =
             *(ulong *)(uVar3 + 0x10) ^
             (*(ulong *)(uVar3 + 0x18) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x20);
        *(ulong *)(uVar3 + 0x18) =
             *(ulong *)(uVar3 + 0x18) ^ (*(ulong *)(uVar3 + 0x20) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x20) = *(ulong *)(uVar3 + 0x20) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x28);
        uVar1 = *(ulong *)(uVar3 + 0x28);
        uVar2 = *(ulong *)(uVar3 + 0x30);
        *(ulong *)(uVar3 + 0x28) =
             *(ulong *)(uVar3 + 0x28) ^
             (*(ulong *)(uVar3 + 0x30) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x38);
        *(ulong *)(uVar3 + 0x30) =
             *(ulong *)(uVar3 + 0x30) ^
             (*(ulong *)(uVar3 + 0x38) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x40);
        *(ulong *)(uVar3 + 0x38) =
             *(ulong *)(uVar3 + 0x38) ^
             (*(ulong *)(uVar3 + 0x40) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x48);
        *(ulong *)(uVar3 + 0x40) =
             *(ulong *)(uVar3 + 0x40) ^ (*(ulong *)(uVar3 + 0x48) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x48) = *(ulong *)(uVar3 + 0x48) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x50);
        uVar1 = *(ulong *)(uVar3 + 0x50);
        uVar2 = *(ulong *)(uVar3 + 0x58);
        *(ulong *)(uVar3 + 0x50) =
             *(ulong *)(uVar3 + 0x50) ^
             (*(ulong *)(uVar3 + 0x58) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x60);
        *(ulong *)(uVar3 + 0x58) =
             *(ulong *)(uVar3 + 0x58) ^
             (*(ulong *)(uVar3 + 0x60) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x68);
        *(ulong *)(uVar3 + 0x60) =
             *(ulong *)(uVar3 + 0x60) ^
             (*(ulong *)(uVar3 + 0x68) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x70);
        *(ulong *)(uVar3 + 0x68) =
             *(ulong *)(uVar3 + 0x68) ^ (*(ulong *)(uVar3 + 0x70) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x70) = *(ulong *)(uVar3 + 0x70) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x78);
        uVar1 = *(ulong *)(uVar3 + 0x78);
        uVar2 = *(ulong *)(uVar3 + 0x80);
        *(ulong *)(uVar3 + 0x78) =
             *(ulong *)(uVar3 + 0x78) ^
             (*(ulong *)(uVar3 + 0x80) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x88);
        *(ulong *)(uVar3 + 0x80) =
             *(ulong *)(uVar3 + 0x80) ^
             (*(ulong *)(uVar3 + 0x88) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x90);
        *(ulong *)(uVar3 + 0x88) =
             *(ulong *)(uVar3 + 0x88) ^
             (*(ulong *)(uVar3 + 0x90) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x98);
        *(ulong *)(uVar3 + 0x90) =
             *(ulong *)(uVar3 + 0x90) ^ (*(ulong *)(uVar3 + 0x98) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x98) = *(ulong *)(uVar3 + 0x98) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0xa0);
        uVar1 = *(ulong *)(uVar3 + 0xa0);
        uVar2 = *(ulong *)(uVar3 + 0xa8);
        *(ulong *)(uVar3 + 0xa0) =
             *(ulong *)(uVar3 + 0xa0) ^
             (*(ulong *)(uVar3 + 0xa8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xb0);
        *(ulong *)(uVar3 + 0xa8) =
             *(ulong *)(uVar3 + 0xa8) ^
             (*(ulong *)(uVar3 + 0xb0) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xb8);
        *(ulong *)(uVar3 + 0xb0) =
             *(ulong *)(uVar3 + 0xb0) ^
             (*(ulong *)(uVar3 + 0xb8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xc0);
        *(ulong *)(uVar3 + 0xb8) =
             *(ulong *)(uVar3 + 0xb8) ^ (*(ulong *)(uVar3 + 0xc0) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0xc0) = *(ulong *)(uVar3 + 0xc0) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        *(ulong *)uVar3 = *(ulong *)uVar3 ^ Hacl_Hash_SHA3_keccak_rndc[local_3f4];
      }
      hbuf_2._252_4_ = hbuf_2._252_4_ + 1;
    }
    uVar4 = block_len(a);
    memset(ws_1 + 0x1f,0,0x100);
    memset(&i0_1,0,0x100);
    memcpy(&i0_1,(void *)uVar3,200);
    for (local_7bc = 0; local_7bc < 0x20; local_7bc = local_7bc + 1) {
      _Var7 = __uint64_identity(*(__uint64_t *)(&i0_1 + (ulong)local_7bc * 2));
      store64((uint8_t *)((long)ws_1 + (ulong)(local_7bc << 3) + 0xf8),_Var7);
    }
    memcpy(output + ((ulong)l - (ulong)(l % uVar4)),ws_1 + 0x1f,(ulong)(l % uVar4));
  }
  else {
    local_7c0 = 0;
    while( true ) {
      uVar4 = hash_len(a);
      uVar5 = block_len(a);
      if (uVar4 / uVar5 <= local_7c0) break;
      memset(ws_3 + 0x1f,0,0x100);
      memset(&stack0xfffffffffffff638,0,0x100);
      memcpy(&stack0xfffffffffffff638,(void *)uVar3,200);
      for (b0_1._4_4_ = 0; b0_1._4_4_ < 0x20; b0_1._4_4_ = b0_1._4_4_ + 1) {
        _Var7 = __uint64_identity(ws_3[(ulong)b0_1._4_4_ - 1]);
        store64((uint8_t *)((long)ws_3 + (ulong)(b0_1._4_4_ << 3) + 0xf8),_Var7);
      }
      uVar4 = block_len(a);
      uVar5 = block_len(a);
      memcpy(output + local_7c0 * uVar4,ws_3 + 0x1f,(ulong)uVar5);
      for (local_9e4 = 0; local_9e4 < 0x18; local_9e4 = local_9e4 + 1) {
        memset(&i2_1,0,0x28);
        _i2_1 = *(ulong *)uVar3 ^
                *(ulong *)(uVar3 + 0x28) ^
                *(ulong *)(uVar3 + 0x50) ^ *(ulong *)(uVar3 + 0x78) ^ *(ulong *)(uVar3 + 0xa0);
        _C_1[0] = *(ulong *)(uVar3 + 8) ^
                  *(ulong *)(uVar3 + 0x30) ^
                  *(ulong *)(uVar3 + 0x58) ^ *(ulong *)(uVar3 + 0x80) ^ *(ulong *)(uVar3 + 0xa8);
        _C_1[1] = *(ulong *)(uVar3 + 0x10) ^
                  *(ulong *)(uVar3 + 0x38) ^
                  *(ulong *)(uVar3 + 0x60) ^ *(ulong *)(uVar3 + 0x88) ^ *(ulong *)(uVar3 + 0xb0);
        _C_1[2] = *(ulong *)(uVar3 + 0x18) ^
                  *(ulong *)(uVar3 + 0x40) ^
                  *(ulong *)(uVar3 + 0x68) ^ *(ulong *)(uVar3 + 0x90) ^ *(ulong *)(uVar3 + 0xb8);
        _C_1[3] = *(ulong *)(uVar3 + 0x20) ^
                  *(ulong *)(uVar3 + 0x48) ^
                  *(ulong *)(uVar3 + 0x70) ^ *(ulong *)(uVar3 + 0x98) ^ *(ulong *)(uVar3 + 0xc0);
        uVar8 = _C_1[3] ^ (_C_1[0] << 1 | _C_1[0] >> 0x3f);
        *(ulong *)uVar3 = *(ulong *)uVar3 ^ uVar8;
        *(ulong *)(uVar3 + 0x28) = *(ulong *)(uVar3 + 0x28) ^ uVar8;
        *(ulong *)(uVar3 + 0x50) = *(ulong *)(uVar3 + 0x50) ^ uVar8;
        *(ulong *)(uVar3 + 0x78) = *(ulong *)(uVar3 + 0x78) ^ uVar8;
        *(ulong *)(uVar3 + 0xa0) = *(ulong *)(uVar3 + 0xa0) ^ uVar8;
        uVar8 = _i2_1 ^ (_C_1[1] << 1 | _C_1[1] >> 0x3f);
        *(ulong *)(uVar3 + 8) = *(ulong *)(uVar3 + 8) ^ uVar8;
        *(ulong *)(uVar3 + 0x30) = *(ulong *)(uVar3 + 0x30) ^ uVar8;
        *(ulong *)(uVar3 + 0x58) = *(ulong *)(uVar3 + 0x58) ^ uVar8;
        *(ulong *)(uVar3 + 0x80) = *(ulong *)(uVar3 + 0x80) ^ uVar8;
        *(ulong *)(uVar3 + 0xa8) = *(ulong *)(uVar3 + 0xa8) ^ uVar8;
        uVar8 = _C_1[0] ^ (_C_1[2] << 1 | _C_1[2] >> 0x3f);
        *(ulong *)(uVar3 + 0x10) = *(ulong *)(uVar3 + 0x10) ^ uVar8;
        *(ulong *)(uVar3 + 0x38) = *(ulong *)(uVar3 + 0x38) ^ uVar8;
        *(ulong *)(uVar3 + 0x60) = *(ulong *)(uVar3 + 0x60) ^ uVar8;
        *(ulong *)(uVar3 + 0x88) = *(ulong *)(uVar3 + 0x88) ^ uVar8;
        *(ulong *)(uVar3 + 0xb0) = *(ulong *)(uVar3 + 0xb0) ^ uVar8;
        uVar8 = _C_1[1] ^ (_C_1[3] << 1 | _C_1[3] >> 0x3f);
        *(ulong *)(uVar3 + 0x18) = *(ulong *)(uVar3 + 0x18) ^ uVar8;
        *(ulong *)(uVar3 + 0x40) = *(ulong *)(uVar3 + 0x40) ^ uVar8;
        *(ulong *)(uVar3 + 0x68) = *(ulong *)(uVar3 + 0x68) ^ uVar8;
        *(ulong *)(uVar3 + 0x90) = *(ulong *)(uVar3 + 0x90) ^ uVar8;
        *(ulong *)(uVar3 + 0xb8) = *(ulong *)(uVar3 + 0xb8) ^ uVar8;
        uVar8 = _C_1[2] ^ (_i2_1 << 1 | _i2_1 >> 0x3f);
        *(ulong *)(uVar3 + 0x20) = *(ulong *)(uVar3 + 0x20) ^ uVar8;
        *(ulong *)(uVar3 + 0x48) = *(ulong *)(uVar3 + 0x48) ^ uVar8;
        *(ulong *)(uVar3 + 0x70) = *(ulong *)(uVar3 + 0x70) ^ uVar8;
        *(ulong *)(uVar3 + 0x98) = *(ulong *)(uVar3 + 0x98) ^ uVar8;
        *(ulong *)(uVar3 + 0xc0) = *(ulong *)(uVar3 + 0xc0) ^ uVar8;
        __Y_1 = *(ulong *)(uVar3 + 8);
        for (r1_1 = 0; r1_1 < 0x18; r1_1 = r1_1 + 1) {
          uVar8 = *(ulong *)(uVar3 + (ulong)Hacl_Hash_SHA3_keccak_piln[r1_1] * 8);
          *(ulong *)(uVar3 + (ulong)Hacl_Hash_SHA3_keccak_piln[r1_1] * 8) =
               __Y_1 << ((byte)Hacl_Hash_SHA3_keccak_rotc[r1_1] & 0x3f) |
               __Y_1 >> (0x40 - (byte)Hacl_Hash_SHA3_keccak_rotc[r1_1] & 0x3f);
          __Y_1 = uVar8;
        }
        uVar8 = *(ulong *)uVar3;
        uVar1 = *(ulong *)uVar3;
        uVar2 = *(ulong *)(uVar3 + 8);
        *(ulong *)uVar3 =
             *(ulong *)uVar3 ^
             (*(ulong *)(uVar3 + 8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x10);
        *(ulong *)(uVar3 + 8) =
             *(ulong *)(uVar3 + 8) ^
             (*(ulong *)(uVar3 + 0x10) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x18);
        *(ulong *)(uVar3 + 0x10) =
             *(ulong *)(uVar3 + 0x10) ^
             (*(ulong *)(uVar3 + 0x18) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x20);
        *(ulong *)(uVar3 + 0x18) =
             *(ulong *)(uVar3 + 0x18) ^ (*(ulong *)(uVar3 + 0x20) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x20) = *(ulong *)(uVar3 + 0x20) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x28);
        uVar1 = *(ulong *)(uVar3 + 0x28);
        uVar2 = *(ulong *)(uVar3 + 0x30);
        *(ulong *)(uVar3 + 0x28) =
             *(ulong *)(uVar3 + 0x28) ^
             (*(ulong *)(uVar3 + 0x30) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x38);
        *(ulong *)(uVar3 + 0x30) =
             *(ulong *)(uVar3 + 0x30) ^
             (*(ulong *)(uVar3 + 0x38) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x40);
        *(ulong *)(uVar3 + 0x38) =
             *(ulong *)(uVar3 + 0x38) ^
             (*(ulong *)(uVar3 + 0x40) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x48);
        *(ulong *)(uVar3 + 0x40) =
             *(ulong *)(uVar3 + 0x40) ^ (*(ulong *)(uVar3 + 0x48) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x48) = *(ulong *)(uVar3 + 0x48) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x50);
        uVar1 = *(ulong *)(uVar3 + 0x50);
        uVar2 = *(ulong *)(uVar3 + 0x58);
        *(ulong *)(uVar3 + 0x50) =
             *(ulong *)(uVar3 + 0x50) ^
             (*(ulong *)(uVar3 + 0x58) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x60);
        *(ulong *)(uVar3 + 0x58) =
             *(ulong *)(uVar3 + 0x58) ^
             (*(ulong *)(uVar3 + 0x60) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x68);
        *(ulong *)(uVar3 + 0x60) =
             *(ulong *)(uVar3 + 0x60) ^
             (*(ulong *)(uVar3 + 0x68) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x70);
        *(ulong *)(uVar3 + 0x68) =
             *(ulong *)(uVar3 + 0x68) ^ (*(ulong *)(uVar3 + 0x70) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x70) = *(ulong *)(uVar3 + 0x70) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0x78);
        uVar1 = *(ulong *)(uVar3 + 0x78);
        uVar2 = *(ulong *)(uVar3 + 0x80);
        *(ulong *)(uVar3 + 0x78) =
             *(ulong *)(uVar3 + 0x78) ^
             (*(ulong *)(uVar3 + 0x80) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x88);
        *(ulong *)(uVar3 + 0x80) =
             *(ulong *)(uVar3 + 0x80) ^
             (*(ulong *)(uVar3 + 0x88) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x90);
        *(ulong *)(uVar3 + 0x88) =
             *(ulong *)(uVar3 + 0x88) ^
             (*(ulong *)(uVar3 + 0x90) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0x98);
        *(ulong *)(uVar3 + 0x90) =
             *(ulong *)(uVar3 + 0x90) ^ (*(ulong *)(uVar3 + 0x98) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0x98) = *(ulong *)(uVar3 + 0x98) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        uVar8 = *(ulong *)(uVar3 + 0xa0);
        uVar1 = *(ulong *)(uVar3 + 0xa0);
        uVar2 = *(ulong *)(uVar3 + 0xa8);
        *(ulong *)(uVar3 + 0xa0) =
             *(ulong *)(uVar3 + 0xa0) ^
             (*(ulong *)(uVar3 + 0xa8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xb0);
        *(ulong *)(uVar3 + 0xa8) =
             *(ulong *)(uVar3 + 0xa8) ^
             (*(ulong *)(uVar3 + 0xb0) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xb8);
        *(ulong *)(uVar3 + 0xb0) =
             *(ulong *)(uVar3 + 0xb0) ^
             (*(ulong *)(uVar3 + 0xb8) ^ 0xffffffffffffffff) & *(ulong *)(uVar3 + 0xc0);
        *(ulong *)(uVar3 + 0xb8) =
             *(ulong *)(uVar3 + 0xb8) ^ (*(ulong *)(uVar3 + 0xc0) ^ 0xffffffffffffffff) & uVar8;
        *(ulong *)(uVar3 + 0xc0) = *(ulong *)(uVar3 + 0xc0) ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
        *(ulong *)uVar3 = *(ulong *)uVar3 ^ Hacl_Hash_SHA3_keccak_rndc[local_9e4];
      }
      local_7c0 = local_7c0 + 1;
    }
    uVar4 = hash_len(a);
    uVar5 = block_len(a);
    memset(ws + 0x1f,0,0x100);
    memset(&stack0xfffffffffffff258,0,0x100);
    memcpy(&stack0xfffffffffffff258,(void *)uVar3,200);
    for (uu____6._4_4_ = 0; uu____6._4_4_ < 0x20; uu____6._4_4_ = uu____6._4_4_ + 1) {
      _Var7 = __uint64_identity(ws[(ulong)uu____6._4_4_ - 1]);
      store64((uint8_t *)((long)ws + (ulong)(uu____6._4_4_ << 3) + 0xf8),_Var7);
    }
    uVar6 = hash_len(a);
    memcpy(output + ((ulong)uVar6 - (ulong)(uVar4 % uVar5)),ws + 0x1f,(ulong)(uVar4 % uVar5));
  }
  return;
}

Assistant:

static void
digest_(
  Spec_Hash_Definitions_hash_alg a,
  Hacl_Hash_SHA3_state_t *state,
  uint8_t *output,
  uint32_t l
)
{
  Hacl_Hash_SHA3_state_t scrut0 = *state;
  Hacl_Hash_SHA3_hash_buf block_state = scrut0.block_state;
  uint8_t *buf_ = scrut0.buf;
  uint64_t total_len = scrut0.total_len;
  uint32_t r;
  if (total_len % (uint64_t)block_len(a) == 0ULL && total_len > 0ULL)
  {
    r = block_len(a);
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)block_len(a));
  }
  uint8_t *buf_1 = buf_;
  uint64_t buf[25U] = { 0U };
  Hacl_Hash_SHA3_hash_buf tmp_block_state = { .fst = a, .snd = buf };
  hash_buf2 scrut = { .fst = block_state, .snd = tmp_block_state };
  uint64_t *s_dst = scrut.snd.snd;
  uint64_t *s_src = scrut.fst.snd;
  memcpy(s_dst, s_src, 25U * sizeof (uint64_t));
  uint32_t ite;
  if (r % block_len(a) == 0U && r > 0U)
  {
    ite = block_len(a);
  }
  else
  {
    ite = r % block_len(a);
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Spec_Hash_Definitions_hash_alg a1 = tmp_block_state.fst;
  uint64_t *s0 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_multi_sha3(a1, s0, buf_multi, 0U / block_len(a1));
  Spec_Hash_Definitions_hash_alg a10 = tmp_block_state.fst;
  uint64_t *s1 = tmp_block_state.snd;
  Hacl_Hash_SHA3_update_last_sha3(a10, s1, buf_last, r);
  Spec_Hash_Definitions_hash_alg a11 = tmp_block_state.fst;
  uint64_t *s = tmp_block_state.snd;
  if (a11 == Spec_Hash_Definitions_Shake128 || a11 == Spec_Hash_Definitions_Shake256)
  {
    for (uint32_t i0 = 0U; i0 < l / block_len(a11); i0++)
    {
      uint8_t hbuf[256U] = { 0U };
      uint64_t ws[32U] = { 0U };
      memcpy(ws, s, 25U * sizeof (uint64_t));
      for (uint32_t i = 0U; i < 32U; i++)
      {
        store64_le(hbuf + i * 8U, ws[i]);
      }
      uint8_t *b0 = output;
      uint8_t *uu____0 = hbuf;
      memcpy(b0 + i0 * block_len(a11), uu____0, block_len(a11) * sizeof (uint8_t));
      for (uint32_t i1 = 0U; i1 < 24U; i1++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i2,
          0U,
          5U,
          1U,
          uint64_t uu____1 = _C[(i2 + 1U) % 5U];
          uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____1 << 1U | uu____1 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____2 = current;
          s[_Y] = uu____2 << r1 | uu____2 >> (64U - r1);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
        s[0U] = s[0U] ^ c;
      }
    }
    uint32_t remOut = l % block_len(a11);
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    memcpy(output + l - remOut, hbuf, remOut * sizeof (uint8_t));
    return;
  }
  for (uint32_t i0 = 0U; i0 < hash_len(a11) / block_len(a11); i0++)
  {
    uint8_t hbuf[256U] = { 0U };
    uint64_t ws[32U] = { 0U };
    memcpy(ws, s, 25U * sizeof (uint64_t));
    for (uint32_t i = 0U; i < 32U; i++)
    {
      store64_le(hbuf + i * 8U, ws[i]);
    }
    uint8_t *b0 = output;
    uint8_t *uu____3 = hbuf;
    memcpy(b0 + i0 * block_len(a11), uu____3, block_len(a11) * sizeof (uint8_t));
    for (uint32_t i1 = 0U; i1 < 24U; i1++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i2,
        0U,
        5U,
        1U,
        uint64_t uu____4 = _C[(i2 + 1U) % 5U];
        uint64_t _D = _C[(i2 + 4U) % 5U] ^ (uu____4 << 1U | uu____4 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i2 + 5U * i] = s[i2 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r1 = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____5 = current;
        s[_Y] = uu____5 << r1 | uu____5 >> (64U - r1);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i1];
      s[0U] = s[0U] ^ c;
    }
  }
  uint32_t remOut = hash_len(a11) % block_len(a11);
  uint8_t hbuf[256U] = { 0U };
  uint64_t ws[32U] = { 0U };
  memcpy(ws, s, 25U * sizeof (uint64_t));
  for (uint32_t i = 0U; i < 32U; i++)
  {
    store64_le(hbuf + i * 8U, ws[i]);
  }
  uint8_t *uu____6 = hbuf;
  memcpy(output + hash_len(a11) - remOut, uu____6, remOut * sizeof (uint8_t));
}